

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O3

void __thiscall helics::EndpointInfo::removeTarget(EndpointInfo *this,GlobalHandle targetId)

{
  pointer ppVar1;
  pointer pEVar2;
  iterator iVar3;
  pointer pEVar4;
  long lVar5;
  pointer pEVar6;
  long lVar7;
  GlobalFederateId GVar8;
  pointer pEVar9;
  long lVar10;
  InterfaceHandle IVar11;
  EndpointInformation *targetInfo;
  iterator __last;
  
  iVar3._M_current =
       (this->targetInformation).
       super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->targetInformation).
       super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  GVar8 = targetId.fed_id.gid;
  IVar11 = targetId.handle.hid;
  if (iVar3._M_current != __last._M_current) {
    lVar7 = (long)__last._M_current - (long)iVar3._M_current;
    lVar5 = (lVar7 >> 3) * -0x71c71c71c71c71c7 >> 2;
    if (0 < lVar5) {
      pEVar4 = iVar3._M_current + lVar5 * 4;
      lVar5 = lVar5 + 1;
      iVar3._M_current = iVar3._M_current + 2;
      do {
        if ((iVar3._M_current[-2].id.fed_id.gid == GVar8.gid) &&
           (iVar3._M_current[-2].id.handle.hid == IVar11.hid)) {
          iVar3._M_current = iVar3._M_current + -2;
          goto LAB_002e191a;
        }
        if ((iVar3._M_current[-1].id.fed_id.gid == GVar8.gid) &&
           (iVar3._M_current[-1].id.handle.hid == IVar11.hid)) {
          iVar3._M_current = iVar3._M_current + -1;
          goto LAB_002e191a;
        }
        if ((((iVar3._M_current)->id).fed_id.gid == GVar8.gid) &&
           (((iVar3._M_current)->id).handle.hid == IVar11.hid)) goto LAB_002e191a;
        if ((iVar3._M_current[1].id.fed_id.gid == GVar8.gid) &&
           (iVar3._M_current[1].id.handle.hid == IVar11.hid)) {
          iVar3._M_current = iVar3._M_current + 1;
          goto LAB_002e191a;
        }
        lVar5 = lVar5 + -1;
        iVar3._M_current = iVar3._M_current + 4;
      } while (1 < lVar5);
      lVar7 = (long)__last._M_current - (long)pEVar4;
      iVar3._M_current = pEVar4;
    }
    lVar5 = (lVar7 >> 3) * -0x71c71c71c71c71c7;
    if (lVar5 == 1) {
LAB_002e1906:
      if (IVar11.hid != ((iVar3._M_current)->id).handle.hid ||
          GVar8.gid != ((iVar3._M_current)->id).fed_id.gid) {
        iVar3._M_current = __last._M_current;
      }
    }
    else if (lVar5 == 3) {
      if ((((iVar3._M_current)->id).fed_id.gid != GVar8.gid) ||
         (((iVar3._M_current)->id).handle.hid != IVar11.hid)) {
        iVar3._M_current = iVar3._M_current + 1;
        goto LAB_002e18ec;
      }
    }
    else {
      if (lVar5 != 2) goto LAB_002e19f0;
LAB_002e18ec:
      if ((((iVar3._M_current)->id).fed_id.gid != GVar8.gid) ||
         (((iVar3._M_current)->id).handle.hid != IVar11.hid)) {
        iVar3._M_current = iVar3._M_current + 1;
        goto LAB_002e1906;
      }
    }
LAB_002e191a:
    if (iVar3._M_current != __last._M_current) {
      pEVar4 = iVar3._M_current + 1;
      if (pEVar4 != __last._M_current) {
        do {
          if (((pEVar4->id).fed_id.gid != GVar8.gid) || ((pEVar4->id).handle.hid != IVar11.hid)) {
            (iVar3._M_current)->id = pEVar4->id;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &(iVar3._M_current)->key,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pEVar4->key);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &(iVar3._M_current)->type,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &pEVar4->type);
            iVar3._M_current = iVar3._M_current + 1;
          }
          pEVar4 = pEVar4 + 1;
        } while (pEVar4 != __last._M_current);
        __last._M_current =
             (this->targetInformation).
             super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (iVar3._M_current != __last._M_current) {
        std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
        _M_erase(&this->targetInformation,iVar3,__last);
        ppVar1 = (this->targets).
                 super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->targets).
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
          (this->targets).
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
        }
        pEVar4 = (this->targetInformation).
                 super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar2 = (this->targetInformation).
                 super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pEVar4 != pEVar2) {
          do {
            std::
            vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
            ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
                      ((vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
                        *)&this->targets,&pEVar4->id,&pEVar4->key);
            pEVar4 = pEVar4 + 1;
          } while (pEVar4 != pEVar2);
        }
      }
    }
  }
LAB_002e19f0:
  pEVar4 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar4 == pEVar2) {
    return;
  }
  lVar7 = (long)pEVar2 - (long)pEVar4;
  lVar10 = (lVar7 >> 3) * -0x71c71c71c71c71c7 >> 2;
  pEVar6 = pEVar4;
  lVar5 = lVar7;
  iVar3._M_current = pEVar2;
  if (0 < lVar10) {
    pEVar6 = pEVar4 + lVar10 * 4;
    lVar10 = lVar10 + 1;
    pEVar9 = pEVar4 + 2;
    do {
      if ((pEVar9[-2].id.fed_id.gid == GVar8.gid) && (pEVar9[-2].id.handle.hid == IVar11.hid)) {
        pEVar9 = pEVar9 + -2;
        goto LAB_002e1b36;
      }
      if ((pEVar9[-1].id.fed_id.gid == GVar8.gid) && (pEVar9[-1].id.handle.hid == IVar11.hid)) {
        pEVar9 = pEVar9 + -1;
        goto LAB_002e1b36;
      }
      if (((pEVar9->id).fed_id.gid == GVar8.gid) && ((pEVar9->id).handle.hid == IVar11.hid))
      goto LAB_002e1b36;
      if ((pEVar9[1].id.fed_id.gid == GVar8.gid) && (pEVar9[1].id.handle.hid == IVar11.hid)) {
        pEVar9 = pEVar9 + 1;
        goto LAB_002e1b36;
      }
      lVar10 = lVar10 + -1;
      pEVar9 = pEVar9 + 4;
    } while (1 < lVar10);
    lVar5 = (long)pEVar2 - (long)pEVar6;
  }
  lVar5 = (lVar5 >> 3) * -0x71c71c71c71c71c7;
  if (lVar5 == 1) {
LAB_002e1b26:
    pEVar9 = pEVar6;
    if (IVar11.hid != (pEVar6->id).handle.hid || GVar8.gid != (pEVar6->id).fed_id.gid) {
      pEVar9 = pEVar2;
    }
  }
  else if (lVar5 == 3) {
    if (((pEVar6->id).fed_id.gid != GVar8.gid) ||
       (pEVar9 = pEVar6, (pEVar6->id).handle.hid != IVar11.hid)) {
      pEVar6 = pEVar6 + 1;
      goto LAB_002e1af9;
    }
  }
  else {
    if (lVar5 != 2) goto LAB_002e1bab;
LAB_002e1af9:
    if (((pEVar6->id).fed_id.gid != GVar8.gid) ||
       (pEVar9 = pEVar6, (pEVar6->id).handle.hid != IVar11.hid)) {
      pEVar6 = pEVar6 + 1;
      goto LAB_002e1b26;
    }
  }
LAB_002e1b36:
  if ((pEVar9 != pEVar2) && (pEVar6 = pEVar9 + 1, iVar3._M_current = pEVar9, pEVar6 != pEVar2)) {
    do {
      if (((pEVar6->id).fed_id.gid != GVar8.gid) || ((pEVar6->id).handle.hid != IVar11.hid)) {
        pEVar9->id = pEVar6->id;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar9->key,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar6->key)
        ;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar9->type
                  ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pEVar6->type);
        pEVar9 = pEVar9 + 1;
      }
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 != pEVar2);
    pEVar4 = (this->sourceInformation).
             super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(this->sourceInformation).
                  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4;
    iVar3._M_current = pEVar9;
  }
LAB_002e1bab:
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::_M_erase
            (&this->sourceInformation,iVar3,
             (EndpointInformation *)((long)&(pEVar4->id).fed_id.gid + lVar7));
  return;
}

Assistant:

void EndpointInfo::removeTarget(GlobalHandle targetId)
{
    if (!targetInformation.empty()) {
        auto removeIterator = std::remove_if(targetInformation.begin(),
                                             targetInformation.end(),
                                             [targetId](const auto& targetInfo) {
                                                 return targetInfo.id == targetId;
                                             });
        if (removeIterator != targetInformation.end()) {
            targetInformation.erase(removeIterator, targetInformation.end());
            targets.clear();
            for (const auto& targetInfo : targetInformation) {
                targets.emplace_back(targetInfo.id, targetInfo.key);
            }
        }
    }
    if (!sourceInformation.empty()) {
        auto removeIterator =
            std::remove_if(sourceInformation.begin(),
                           sourceInformation.end(),
                           [targetId](const auto& sinfo) { return sinfo.id == targetId; });
        sourceInformation.erase(removeIterator, sourceInformation.end());
    }
}